

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_string.c
# Opt level: O0

int dwarfstring_append_printf_u(dwarfstring *data,char *format,dwarfstring_u v)

{
  long lVar1;
  char *__nptr;
  ulong uVar2;
  size_t slen;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  size_t trailinglen;
  size_t prefixcount;
  size_t justcount;
  dwarfstring_u dig_1;
  dwarfstring_u dig;
  dwarfstring_u remaining;
  char *pcStack_b0;
  uint digcharlen;
  char *digptr;
  char digbuf [36];
  size_t prefixlen;
  size_t divisor;
  char *ctable;
  int Xcount;
  int xcount;
  int dcount;
  int ucount;
  int lcount;
  int leadingzero;
  size_t fixedlen;
  char *numptr;
  char *endptr;
  long val;
  size_t next;
  dwarfstring_u v_local;
  char *format_local;
  dwarfstring *data_local;
  
  val = 0;
  endptr = (char *)0x0;
  numptr = (char *)0x0;
  _lcount = (char *)0x0;
  stack0xffffffffffffff80 = 0;
  next = v;
  v_local = (dwarfstring_u)format;
  format_local = (char *)data;
  if (format == (char *)0x0) {
    dwarfstring_append_length
              (data,"<DWARFSTRINGERR: null format pointer to dwarfstring_append_printf_u>",0x44);
  }
  else {
    while( true ) {
      bVar3 = false;
      if (format[val] != '\0') {
        bVar3 = format[val] != '%';
      }
      if (!bVar3) break;
      val = val + 1;
      register0x00000000 = stack0xffffffffffffff80 + 1;
    }
    dwarfstring_append_length(data,format,stack0xffffffffffffff80);
    if (*(char *)(v_local + val) == '%') {
      lVar1 = val + 1;
      if (*(char *)(v_local + lVar1) == '\0') {
        val = lVar1;
        dwarfstring_append_length
                  ((dwarfstring_s *)format_local,
                   "<DWARFSTRINGERR: empty percent  to dwarfstring_append_printf_u>",0x3f);
      }
      else if (*(char *)(v_local + lVar1) == ' ') {
        val = lVar1;
        dwarfstring_append_length
                  ((dwarfstring_s *)format_local,
                   "<DWARFSTRINGERR: empty percent  to dwarfstring_append_printf_u>",0x3f);
      }
      else if (*(char *)(v_local + lVar1) == '-') {
        val = lVar1;
        dwarfstring_append_length
                  ((dwarfstring_s *)format_local,
                   "<DWARFSTRINGERR: format - passed to dwarfstring_append_printf_u cannot be handled>"
                   ,0x52);
      }
      else {
        bVar3 = *(char *)(v_local + lVar1) == '0';
        if (bVar3) {
          lVar1 = val + 2;
        }
        val = lVar1;
        __nptr = (char *)(v_local + val);
        endptr = (char *)strtol(__nptr,&numptr,10);
        if (numptr != __nptr) {
          _lcount = endptr;
        }
        val = (long)numptr - v_local;
        bVar4 = *(char *)(v_local + val) == 'l';
        if (bVar4) {
          val = val + 1;
        }
        dcount = (int)bVar4;
        if (*(char *)(v_local + val) == 'l') {
          dcount = dcount + 1;
          val = val + 1;
        }
        if (*(char *)(v_local + val) == 'l') {
          dcount = dcount + 1;
          val = val + 1;
        }
        bVar4 = *(char *)(v_local + val) == 'u';
        if (bVar4) {
          val = val + 1;
        }
        xcount = (int)bVar4;
        bVar4 = *(char *)(v_local + val) == 'd';
        if (bVar4) {
          val = val + 1;
        }
        Xcount = (int)bVar4;
        bVar5 = *(char *)(v_local + val) == 'x';
        if (bVar5) {
          val = val + 1;
        }
        ctable._4_4_ = (uint)bVar5;
        bVar5 = *(char *)(v_local + val) == 'X';
        if (bVar5) {
          val = val + 1;
        }
        ctable._0_4_ = (uint)bVar5;
        if (*(char *)(v_local + val) == 's') {
          dwarfstring_append_length
                    ((dwarfstring_s *)format_local,
                     "<DWARFSTRINGERR: format percent-s passed to dwarfstring_append_printf_u cannot be handled>"
                     ,0x5a);
        }
        else if ((uint)ctable + ctable._4_4_ + Xcount + xcount < 2) {
          if ((uint)ctable + ctable._4_4_ + Xcount + xcount == 0) {
            dwarfstring_append_length
                      ((dwarfstring_s *)format_local,
                       "<DWARFSTRINGERR: format percent x X d u missing to dwarfstring_append_printf_u cannot be handled>"
                       ,0x61);
          }
          else if ((uint)dcount < 3) {
            if (bVar4) {
              dwarfstring_append_length
                        ((dwarfstring_s *)format_local,
                         "<DWARFSTRINGERR: format  percent-d to dwarfstring_append_printf_u cannot be handled>"
                         ,0x54);
            }
            else {
              if (xcount == 0) {
                prefixlen = 0x10;
                if (ctable._4_4_ == 0) {
                  divisor = (size_t)Xtable;
                }
                else {
                  divisor = (size_t)xtable;
                }
              }
              else {
                prefixlen = 10;
                divisor = (size_t)dtable;
              }
              remaining._4_4_ = 0;
              dig = next;
              if (prefixlen == 0x10) {
                pcStack_b0 = digbuf + 0x1b;
                while( true ) {
                  uVar2 = dig & 0xf;
                  dig = dig >> 4;
                  *pcStack_b0 = *(char *)(divisor + uVar2);
                  remaining._4_4_ = remaining._4_4_ + 1;
                  if (dig == 0) break;
                  pcStack_b0 = pcStack_b0 + -1;
                }
              }
              else {
                digbuf[0x1b] = '\0';
                pcStack_b0 = digbuf + 0x1a;
                while( true ) {
                  uVar2 = dig % prefixlen;
                  dig = dig / prefixlen;
                  *pcStack_b0 = *(char *)(divisor + uVar2);
                  remaining._4_4_ = remaining._4_4_ + 1;
                  if (dig == 0) break;
                  pcStack_b0 = pcStack_b0 + -1;
                }
              }
              if ((char *)(ulong)remaining._4_4_ < _lcount) {
                if (bVar3) {
                  _dwarfstring_append_zeros
                            ((dwarfstring *)format_local,(long)_lcount - (ulong)remaining._4_4_);
                  dwarfstring_append_length
                            ((dwarfstring_s *)format_local,pcStack_b0,(ulong)remaining._4_4_);
                }
                else {
                  _dwarfstring_append_spaces
                            ((dwarfstring *)format_local,(long)_lcount - (ulong)remaining._4_4_);
                  dwarfstring_append_length
                            ((dwarfstring_s *)format_local,pcStack_b0,(ulong)remaining._4_4_);
                }
              }
              else {
                dwarfstring_append_length
                          ((dwarfstring_s *)format_local,pcStack_b0,(ulong)remaining._4_4_);
              }
              if (*(char *)(v_local + val) != '\0') {
                slen = strlen((char *)(v_local + val));
                dwarfstring_append_length
                          ((dwarfstring_s *)format_local,(char *)(v_local + val),slen);
              }
            }
          }
          else {
            dwarfstring_append_length
                      ((dwarfstring_s *)format_local,
                       "<DWARFSTRINGERR: format percent lll to dwarfstring_append_printf_u cannot be handled>"
                       ,0x55);
          }
        }
        else {
          dwarfstring_append_length
                    ((dwarfstring_s *)format_local,
                     "<DWARFSTRINGERR: format  percent -x X d u repeats to dwarfstring_append_printf_u cannot be handled>"
                     ,99);
        }
      }
    }
    else {
      dwarfstring_append_length
                ((dwarfstring_s *)format_local,
                 "<DWARFSTRINGERR: no percent passed to dwarfstring_append_printf_u>",0x42);
    }
  }
  return 0;
}

Assistant:

int dwarfstring_append_printf_u(dwarfstring *data,
    char *format,
    dwarfstring_u v)
{

    size_t next = 0;
    long val = 0;
    char *endptr = 0;
    const char *numptr = 0;
    size_t fixedlen = 0;
    int leadingzero = 0;
    int lcount = 0;
    int ucount = 0;
    int dcount = 0;
    int xcount = 0;
    int Xcount = 0;
    char *ctable = 0;
    size_t divisor = 0;
    size_t prefixlen = 0;

    if (!format) {
        DWSERR("<DWARFSTRINGERR: null format pointer to "
            "dwarfstring_append_printf_u>");
        return FALSE;
    }
    while (format[next] && format[next] != '%') {
        ++next;
        ++prefixlen;
    }
    dwarfstring_append_length(data,format,prefixlen);
    if (format[next] != '%') {
        /*   No % operator found, we are done */
        DWSERR("<DWARFSTRINGERR: no percent passed to "
            "dwarfstring_append_printf_u>");
        return FALSE;
    }
    next++;
    if (!format[next]) {
        DWSERR("<DWARFSTRINGERR: empty percent  to "
            "dwarfstring_append_printf_u>");
        return FALSE;
    }
    if (format[next] == ' ') {
        DWSERR("<DWARFSTRINGERR: empty percent  to "
            "dwarfstring_append_printf_u>");
        return FALSE;
    }
    if (format[next] == '-') {
        DWSERR("<DWARFSTRINGERR: format - passed to "
            "dwarfstring_append_printf_u "
            "cannot be handled>");
        return FALSE;
    }
    if (format[next] == '0') {
        leadingzero = 1;
        next++;
    }
    numptr = format+next;
    val = strtol(numptr,&endptr,10);
    if ( endptr != numptr) {
        fixedlen = val;
    }
    next = (endptr - format);
    /*  Following is lx lu or u or llx llu , we take
        all this to mean 64 bits, */
#ifdef _WIN32
    if (format[next] == 'I') {
        /*lcount++;*/
        next++;
    }
    if (format[next] == '6') {
        /*lcount++;*/
        next++;
    }
    if (format[next] == '4') {
        /*lcount++;*/
        next++;
    }
#endif /* _WIN32 */
    if (format[next] == 'l') {
        lcount++;
        next++;
    }
    if (format[next] == 'l') {
        lcount++;
        next++;
    }
    if (format[next] == 'l') {
        lcount++;
        next++;
    }
    if (format[next] == 'u') {
        ucount++;
        next++;
    }
    if (format[next] == 'd') {
        dcount++;
        next++;
    }
    if (format[next] == 'x') {
        xcount++;
        next++;
    }
    if (format[next] == 'X') {
        Xcount++;
        next++;
    }
    if (format[next] == 's') {
        DWSERR("<DWARFSTRINGERR: format percent-s passed to "
            "dwarfstring_append_printf_u "
            "cannot be handled>");
        return FALSE;
    }
    if ( (Xcount +xcount+dcount+ucount) > 1) {
        DWSERR("<DWARFSTRINGERR: format  percent -x X d u repeats to "
            "dwarfstring_append_printf_u "
            "cannot be handled>");
        return FALSE;
    }
    if ( (Xcount +xcount+dcount+ucount) == 0) {
        DWSERR("<DWARFSTRINGERR: format percent x X d u missing to "
            "dwarfstring_append_printf_u "
            "cannot be handled>");
        return FALSE;
    }
    if (lcount > 2) {
        DWSERR("<DWARFSTRINGERR: format percent lll to "
            "dwarfstring_append_printf_u "
            "cannot be handled>");
        return FALSE;
    }
    if (dcount > 0) {
        DWSERR("<DWARFSTRINGERR: format  percent-d to "
            "dwarfstring_append_printf_u "
            "cannot be handled>");
        return FALSE;
    }
    if (ucount) {
        divisor = 10;
        ctable = dtable;
    } else {
        divisor = 16;
        if (xcount) {
            ctable = xtable;
        } else {
            ctable = Xtable;
        }
    }
    {
        char digbuf[36];
        char *digptr = 0;
        unsigned digcharlen = 0;
        dwarfstring_u remaining = v;

        if (divisor == 16) {
            digptr = digbuf+sizeof(digbuf) -1;
            for ( ;; ) {
                dwarfstring_u dig;
                dig = remaining & 0xf;
                remaining = remaining >> 4;
                *digptr = ctable[dig];
                ++digcharlen;
                if (!remaining) {
                    break;
                }
                --digptr;
            }
        } else {
            digptr = digbuf+sizeof(digbuf) -1;
            *digptr = 0;
            --digptr;
            for ( ;; ) {
                dwarfstring_u dig;
                dig = remaining % divisor;
                remaining /= divisor;
                *digptr = ctable[dig];
                ++digcharlen;
                if (!remaining) {
                    break;
                }
                --digptr;
            }
        }
        if (fixedlen <= digcharlen) {
            dwarfstring_append_length(data,digptr,digcharlen);
        } else {
            if (!leadingzero) {
                size_t justcount = fixedlen - digcharlen;
                _dwarfstring_append_spaces(data,justcount);
                dwarfstring_append_length(data,digptr,digcharlen);
            } else {
                size_t prefixcount = fixedlen - digcharlen;
                _dwarfstring_append_zeros(data,prefixcount);
                dwarfstring_append_length(data,digptr,digcharlen);
            }
        }
    }
    if (format[next]) {
        size_t trailinglen = strlen(format+next);
        dwarfstring_append_length(data,format+next,trailinglen);
    }
    return FALSE;
}